

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerInlineeStart(Lowerer *this,Instr *inlineeStartInstr)

{
  OpCode OVar1;
  _func_int **pp_Var2;
  Instr *pIVar3;
  Func *func;
  Instr *pIVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  uint uVar9;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  FunctionJITTimeInfo *this_00;
  Instr *pIVar13;
  SymOpnd *dst;
  AddrOpnd *src;
  Opnd *pOVar14;
  uint uVar15;
  Instr *pIVar16;
  int iVar17;
  
  pOVar14 = inlineeStartInstr->m_src2;
  if (pOVar14 == (Opnd *)0x0) {
    if ((inlineeStartInstr->m_func->field_0x240 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3903,"(inlineeStartInstr->m_func->m_hasInlineArgsOpt)",
                         "inlineeStartInstr->m_func->m_hasInlineArgsOpt");
      if (!bVar6) goto LAB_005bd845;
      *puVar10 = 0;
    }
    pIVar13 = inlineeStartInstr->m_prev;
  }
  else {
    if (inlineeStartInstr->m_func->firstActualStackOffset == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3907,"(inlineeStartInstr->m_func->firstActualStackOffset != -1)",
                         "This should have been already done in backward pass");
      if (!bVar6) goto LAB_005bd845;
      *puVar10 = 0;
      pOVar14 = inlineeStartInstr->m_src2;
    }
    pSVar11 = IR::Opnd::GetStackSym(pOVar14);
    pIVar13 = (pSVar11->field_5).m_instrDef;
    if ((pIVar13 != (Instr *)0x0 & pSVar11->field_0x18) == 1) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar6) goto LAB_005bd845;
      *puVar10 = 0;
      pIVar13 = (pSVar11->field_5).m_instrDef;
    }
    do {
      if ((pIVar13->m_src2 == (Opnd *)0x0) ||
         (OVar7 = IR::Opnd::GetKind(pIVar13->m_src2), OVar7 != OpndKindSym)) {
LAB_005bd37e:
        pIVar16 = (Instr *)0x0;
      }
      else {
        pOVar14 = pIVar13->m_src2;
        OVar7 = IR::Opnd::GetKind(pOVar14);
        if (OVar7 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
        }
        pp_Var2 = pOVar14[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
        }
        uVar9 = *(uint *)(pp_Var2 + 3);
        uVar15 = uVar9 & 0x100000;
        if ((uVar15 != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
          uVar9 = *(uint *)(pp_Var2 + 3);
          uVar15 = uVar9 & 0x100000;
        }
        if (uVar15 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
          uVar9 = *(uint *)(pp_Var2 + 3);
        }
        if (((((uVar9 & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
            (bVar6 = Func::IsInPhase(inlineeStartInstr->m_func,FGPeepsPhase), !bVar6)) &&
           (bVar6 = Func::IsInPhase(inlineeStartInstr->m_func,FGBuildPhase), !bVar6)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1bf,
                             "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                             ,
                             "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                            );
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
        }
        if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_005bd37e;
        pIVar16 = (Instr *)pp_Var2[5];
      }
      OVar1 = pIVar13->m_opcode;
      if (OVar1 < ArgOut_A_Inline) {
        if (OVar1 != ArgOut_A) {
          if (OVar1 == StartCall) {
            if (pIVar16 != (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                 ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
              if (!bVar6) goto LAB_005bd845;
              *puVar10 = 0;
            }
            break;
          }
LAB_005bd3af:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x390c,
                             "(argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline)"
                             ,
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline"
                            );
          if (!bVar6) goto LAB_005bd845;
          *puVar10 = 0;
        }
LAB_005bd3f2:
        IR::Opnd::GetStackSym(pIVar13->m_src2);
        IR::Instr::FreeSrc2(pIVar13);
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar12);
        this_00 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
        bVar6 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015aabd0,EliminateArgoutForInlineePhase,sourceContextId,
                           functionId);
        if (bVar6) {
          pJVar12 = JITTimeWorkItem::GetJITFunctionBody(inlineeStartInstr->m_func->m_workItem);
          bVar6 = JITTimeFunctionBody::HasOrParentHasArguments(pJVar12);
          if (!bVar6) {
            pIVar13->m_opcode = ArgOut_A_InlineBuiltIn;
            goto LAB_005bd471;
          }
        }
        LowererMD::ChangeToAssign(pIVar13);
      }
      else {
        if (OVar1 == ArgOut_A_Inline) goto LAB_005bd3f2;
        if (OVar1 != ArgOut_A_InlineSpecialized) goto LAB_005bd3af;
      }
LAB_005bd471:
      pIVar13 = pIVar16;
    } while (pIVar16 != (Instr *)0x0);
    pIVar13 = inlineeStartInstr;
    if (inlineeStartInstr->m_opcode == InlineeStart) goto LAB_005bd4ea;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1e8,"(this->m_opcode == Js::OpCode::InlineeStart)",
                       "this->m_opcode == Js::OpCode::InlineeStart");
    if (!bVar6) {
LAB_005bd845:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
    OVar1 = inlineeStartInstr->m_opcode;
    while (OVar1 != InlineeMetaArg) {
LAB_005bd4ea:
      pIVar13 = pIVar13->m_prev;
      OVar1 = pIVar13->m_opcode;
    }
    do {
      pIVar16 = pIVar13;
      pIVar13 = pIVar16->m_prev;
    } while (pIVar16->m_prev->m_opcode == InlineeMetaArg);
    if (pIVar16->m_opcode == InlineeMetaArg) {
      iVar17 = 0;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pIVar13 = inlineeStartInstr;
      do {
        pIVar3 = pIVar16->m_next;
        if (iVar17 == 1) {
          pOVar14 = inlineeStartInstr->m_src1;
          if (pIVar16->m_src1 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar6) goto LAB_005bd845;
            *puVar10 = 0;
          }
          func = pIVar16->m_func;
          if (pOVar14->isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar6) goto LAB_005bd845;
            *puVar10 = 0;
          }
          bVar8 = pOVar14->field_0xb;
          if ((bVar8 & 2) != 0) {
            pOVar14 = IR::Opnd::Copy(pOVar14,func);
            bVar8 = pOVar14->field_0xb;
          }
          pOVar14->field_0xb = bVar8 | 2;
          pIVar16->m_src1 = pOVar14;
        }
        else if (iVar17 == 0) {
          dst = Func::GetNextInlineeFrameArgCountSlotOpnd(pIVar16->m_func);
          src = IR::AddrOpnd::NewNull(pIVar16->m_func);
          InsertMove(&dst->super_Opnd,&src->super_Opnd,pIVar13,true);
        }
        IR::Instr::Unlink(pIVar16);
        IR::Instr::InsertBefore(pIVar13,pIVar16);
        pIVar4 = pIVar16->m_prev;
        LowererMD::ChangeToAssign(pIVar16);
        pIVar13 = pIVar16;
        if (iVar17 == 0) {
          pIVar13 = pIVar4->m_next;
          if (pIVar13 != pIVar16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x3931,"(metaArg == prev->m_next)","metaArg == prev->m_next");
            if (!bVar6) goto LAB_005bd845;
            *puVar10 = 0;
            pIVar13 = pIVar4->m_next;
          }
          pOVar14 = pIVar13->m_src1;
          OVar7 = IR::Opnd::GetKind(pOVar14);
          if (OVar7 != OpndKindIntConst) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
            if (!bVar6) goto LAB_005bd845;
            *puVar10 = 0;
          }
          if (*(char *)&pOVar14[2].m_valueType.field_0 == '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x3936,
                               "(metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true)",
                               "metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true");
            if (!bVar6) goto LAB_005bd845;
            *puVar10 = 0;
          }
          pIVar13->field_0x36 = pIVar13->field_0x36 | 0x20;
          LowererMD::Legalize<false>(pIVar13,false);
        }
        iVar17 = iVar17 + 1;
        pIVar16 = pIVar3;
      } while (pIVar3->m_opcode == InlineeMetaArg);
    }
    pIVar13 = inlineeStartInstr->m_prev;
    if (((inlineeStartInstr->m_func->field_0x240 & 2) == 0) &&
       ((inlineeStartInstr->m_func->parentFunc->field_0x240 & 2) == 0)) {
      IR::Instr::Remove(inlineeStartInstr);
    }
    else {
      IR::Instr::FreeSrc1(inlineeStartInstr);
      IR::Instr::FreeSrc2(inlineeStartInstr);
      IR::Instr::FreeDst(inlineeStartInstr);
    }
  }
  return pIVar13;
}

Assistant:

IR::Instr *
Lowerer::LowerInlineeStart(IR::Instr * inlineeStartInstr)
{
    IR::Opnd *linkOpnd   = inlineeStartInstr->GetSrc2();
    if (!linkOpnd)
    {
        Assert(inlineeStartInstr->m_func->m_hasInlineArgsOpt);
        return inlineeStartInstr->m_prev;
    }

    AssertMsg(inlineeStartInstr->m_func->firstActualStackOffset != -1, "This should have been already done in backward pass");

    IR::Instr *startCall;
    // Free the argOut links and lower them to MOVs
    inlineeStartInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline);
        startCall = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        argInstr->FreeSrc2();
#pragma prefast(suppress:6235, "Non-Zero Constant in Condition")
        if (!PHASE_ON(Js::EliminateArgoutForInlineePhase, this->m_func) || inlineeStartInstr->m_func->GetJITFunctionBody()->HasOrParentHasArguments())
        {
            m_lowererMD.ChangeToAssign(argInstr);
        }
        else
        {
            argInstr->m_opcode = Js::OpCode::ArgOut_A_InlineBuiltIn;
        }

        return false;
    });

    IR::Instr *argInsertInstr = inlineeStartInstr;
    uint i = 0;
    inlineeStartInstr->IterateMetaArgs( [&] (IR::Instr* metaArg)
    {
        if(i == 0)
        {
            Lowerer::InsertMove(metaArg->m_func->GetNextInlineeFrameArgCountSlotOpnd(),
                IR::AddrOpnd::NewNull(metaArg->m_func),
                argInsertInstr);
        }
        if (i == Js::Constants::InlineeMetaArgIndex_FunctionObject)
        {
            metaArg->SetSrc1(inlineeStartInstr->GetSrc1());
        }
        metaArg->Unlink();
        argInsertInstr->InsertBefore(metaArg);
        IR::Instr* prev = metaArg->m_prev;
        m_lowererMD.ChangeToAssign(metaArg);
        if (i == Js::Constants::InlineeMetaArgIndex_Argc)
        {
#if defined(_M_IX86) || defined(_M_X64)
            Assert(metaArg == prev->m_next);
#else //defined(_M_ARM)
            Assert(prev->m_next->m_opcode == Js::OpCode::LDIMM);
#endif
            metaArg = prev->m_next;
            Assert(metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true);
            metaArg->isInlineeEntryInstr = true;
            LowererMD::Legalize(metaArg);
        }
        argInsertInstr = metaArg;
        i++;
        return false;
    });

    IR::Instr* prev = inlineeStartInstr->m_prev;

    if (inlineeStartInstr->m_func->m_hasInlineArgsOpt || inlineeStartInstr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
    {
        inlineeStartInstr->FreeSrc1();
        inlineeStartInstr->FreeSrc2();
        inlineeStartInstr->FreeDst();
    }
    else
    {
        inlineeStartInstr->Remove();
    }

    return prev;
}